

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

PVG_FT_Angle PVG_FT_Atan2(PVG_FT_Fixed dx,PVG_FT_Fixed dy)

{
  undefined1 local_30 [8];
  PVG_FT_Vector v;
  PVG_FT_Fixed dy_local;
  PVG_FT_Fixed dx_local;
  
  if ((dx == 0) && (dy == 0)) {
    dx_local = 0;
  }
  else {
    local_30 = (undefined1  [8])dx;
    v.x = dy;
    v.y = dy;
    ft_trig_prenorm((PVG_FT_Vector *)local_30);
    ft_trig_pseudo_polarize((PVG_FT_Vector *)local_30);
    dx_local = v.x;
  }
  return dx_local;
}

Assistant:

PVG_FT_Angle PVG_FT_Atan2(PVG_FT_Fixed dx, PVG_FT_Fixed dy)
{
    PVG_FT_Vector v;

    if (dx == 0 && dy == 0) return 0;

    v.x = dx;
    v.y = dy;
    ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    return v.y;
}